

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O2

void __thiscall Generator::_run(Generator *this,search *sch,input *in,output *out)

{
  int iVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pnVar4;
  char cVar5;
  action a;
  ezexample *this_00;
  example *input_example;
  predictor *ppVar6;
  Trie *this_01;
  size_t sVar7;
  size_type sVar8;
  pointer pnVar9;
  int i;
  ptag my_tag;
  int iVar10;
  ulong uVar11;
  float local_50c;
  string tmp;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> all;
  vector<nextstr,_std::allocator<nextstr>_> next;
  v_array<unsigned_int> ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  nextstr xx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  IncrementalEditDistance ied;
  ezexample ex;
  
  IncrementalEditDistance::IncrementalEditDistance(&ied,&in->out,1,1,1);
  this_01 = this->dict;
  ref.end_array = (uint *)0x0;
  ref.erase_count = 0;
  ref._begin = (uint *)0x0;
  ref._end = (uint *)0x0;
  iVar1 = (int)(in->in)._M_string_length;
  std::__cxx11::string::assign((char *)out);
  next.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  next.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  next.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar11 = 1;
  do {
    my_tag = (ptag)uVar11;
    if (iVar1 * 2 < (int)my_tag) break;
    ezexample::ezexample
              (&ex,(this->
                   super_SearchTask<input,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).vw_obj,false,(vw *)0x0);
    ezexample::addns(&ex,'l');
    this_00 = ezexample::operator()(&ex,"in",(float)iVar1);
    ezexample::operator()(this_00,"out",(float)(int)my_tag);
    if (iVar1 - my_tag != 0) {
      ezexample::operator()(&ex,"diff",(float)(int)(iVar1 - my_tag));
    }
    ezexample::addns(&ex,'s');
    std::__cxx11::string::string((string *)&tmp,"$",(allocator *)&xx);
    while ((iVar10 = (int)uVar11, (int)(my_tag - 0xf) <= iVar10 && (-1 < iVar10))) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xx,
                     (out->_M_dataplus)._M_p[uVar11],&tmp);
      std::__cxx11::string::operator=((string *)&tmp,(string *)&xx);
      std::__cxx11::string::~string((string *)&xx);
      std::operator+(&local_258,"p=",&tmp);
      ezexample::operator()(&ex,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      uVar11 = (ulong)(iVar10 - 1);
    }
    ezexample::addns(&ex,'c');
    sVar2 = out->_M_string_length;
    for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
      xx._0_8_ = &xx.s._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&xx,'\x01');
      std::operator+(&local_278,"c=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xx);
      ezexample::operator()(&ex,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&xx);
    }
    ezexample::operator()(&ex,"c=$");
    ezexample::addns(&ex,'w');
    std::__cxx11::string::assign((char *)&tmp);
    pcVar3 = (out->_M_dataplus)._M_p;
    sVar2 = out->_M_string_length;
    for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
      cVar5 = pcVar3[sVar8];
      if (cVar5 != '^') {
        if (cVar5 == ' ') {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xx,
                         "w=",&tmp);
          std::operator+(&local_298,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xx,
                         "$");
          ezexample::operator()(&ex,&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&xx);
          std::__cxx11::string::assign((char *)&tmp);
        }
        else {
          std::__cxx11::string::push_back((char)&tmp);
        }
      }
    }
    std::operator+(&local_400,"w=",&tmp);
    ezexample::operator()(&ex,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    if (this_01 != (Trie *)0x0) {
      std::vector<nextstr,_std::allocator<nextstr>_>::clear(&next);
      Trie::get_next(this_01,(char *)0x0,&next);
      ezexample::addns(&ex,'d');
      pnVar4 = next.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_50c = 0.0;
      for (pnVar9 = next.super__Vector_base<nextstr,_std::allocator<nextstr>_>._M_impl.
                    super__Vector_impl_data._M_start; pnVar9 != pnVar4; pnVar9 = pnVar9 + 1) {
        nextstr::nextstr(&xx,pnVar9);
        if (0.0 < xx.cw) {
          all.
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&all.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct((ulong)&all,'\x01');
          std::operator+(&local_2b8,"c=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&all);
          ezexample::operator()(&ex,&local_2b8,xx.cw);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&all);
        }
        if (0.0 < xx.sw) {
          std::operator+(&local_2d8,"mc=",&xx.s);
          ezexample::operator()(&ex,&local_2d8,xx.sw);
          std::__cxx11::string::~string((string *)&local_2d8);
        }
        if (local_50c < xx.sw) {
          local_50c = xx.sw;
        }
        std::__cxx11::string::~string((string *)&xx.s);
      }
      if (0.0 < local_50c) {
        xx._0_8_ = &xx.s._M_string_length;
        std::__cxx11::string::_M_construct((ulong)&xx,'\x01');
        std::operator+(&local_2f8,"best=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xx);
        ezexample::operator()(&ex,&local_2f8,local_50c);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&xx);
      }
    }
    ezexample::addns(&ex,'i');
    std::__cxx11::string::assign((char *)&tmp);
    pcVar3 = (in->in)._M_dataplus._M_p;
    sVar2 = (in->in)._M_string_length;
    for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
      if (pcVar3[sVar8] == ' ') {
        std::operator+(&local_420,"w=",&tmp);
        ezexample::operator()(&ex,&local_420);
        std::__cxx11::string::~string((string *)&local_420);
        std::__cxx11::string::assign((char *)&tmp);
      }
      else {
        std::__cxx11::string::push_back((char)&tmp);
      }
    }
    std::operator+(&local_440,"w=",&tmp);
    ezexample::operator()(&ex,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    v_array<unsigned_int>::clear(&ref);
    IncrementalEditDistance::all_next(&all,&ied);
    Search::predictor::predictor((predictor *)&xx,sch,my_tag);
    input_example = ezexample::get(&ex);
    ppVar6 = Search::predictor::set_input((predictor *)&xx,input_example);
    ppVar6 = Search::predictor::set_allowed(ppVar6,&all);
    a = Search::predictor::predict(ppVar6);
    cVar5 = action2char(a);
    Search::predictor::~predictor((predictor *)&xx);
    if (cVar5 != '$') {
      std::__cxx11::string::push_back((char)out);
      IncrementalEditDistance::append(&ied,cVar5);
      if (this_01 == (Trie *)0x0) {
        this_01 = (Trie *)0x0;
      }
      else {
        this_01 = Trie::step(this_01,cVar5);
      }
    }
    std::
    _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~_Vector_base(&all.
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 );
    std::__cxx11::string::~string((string *)&tmp);
    ezexample::~ezexample(&ex);
    uVar11 = (ulong)(my_tag + 1);
  } while (cVar5 != '$');
  sVar7 = IncrementalEditDistance::finish_distance(&ied);
  this->dist = sVar7;
  Search::search::loss(sch,(float)sVar7 * in->weight);
  std::vector<nextstr,_std::allocator<nextstr>_>::~vector(&next);
  IncrementalEditDistance::~IncrementalEditDistance(&ied);
  return;
}

Assistant:

void _run(Search::search& sch, input& in, output& out)
  { IncrementalEditDistance ied(in.out);

    Trie* cdict = dict;

    v_array<action> ref = v_init<action>();
    int N = in.in.length();
    out = "^";
    vector<nextstr> next;
    for (int m=1; m<=N*2; m++)     // at most |in|*2 outputs
    { ezexample ex(&vw_obj);

      // length info
      ex(vw_namespace('l'))
      ("in", (float)N)
      ("out", (float)m);
      if (N != m)
        ex("diff", (float)(N-m));

      // suffixes thus far
      ex(vw_namespace('s'));
      string tmp("$");
      for (int i=m; i >= m-15 && i >= 0; i--)
      { tmp = out[i] + tmp;
        ex("p=" + tmp);
      }

      // characters thus far
      ex(vw_namespace('c'));
      for (char c : out) ex("c=" + string(1,c));
      ex("c=$");

      // words thus far
      ex(vw_namespace('w'));
      tmp = "";
      for (char c : out)
      { if (c == '^') continue;
        if (c == ' ')
        { ex("w=" + tmp + "$");
          tmp = "";
        }
        else tmp += c;
      }
      ex("w=" + tmp);

      // do we match the trie?
      if (cdict)
      { next.clear();
        cdict->get_next(nullptr, next);
        ex(vw_namespace('d'));
        char best_char = '~'; float best_count = 0.;
        for (auto xx : next)
        { if (xx.cw > 0.) ex("c=" + string(1,xx.c), xx.cw);
          if (xx.sw > 0.) ex("mc=" + xx.s, xx.sw);
          if (xx.sw > best_count) { best_count = xx.sw; best_char = xx.c; }
        }
        if (best_count > 0.)
          ex("best=" + string(1,best_char), best_count);
      }

      // input
      /*
      ex(vw_namespace('i'));
      ex("c=^");
      for (int n=0; n<N; n++)
        ex("c=" + in.in[n]);
      ex("c=$");
      */
      ex(vw_namespace('i'));
      tmp = "";
      for (char c : in.in)
      { if (c == ' ')
        { ex("w=" + tmp);
          tmp = "";
        }
        else tmp += c;
      }
      ex("w=" + tmp);

      ref.clear();

      /*
      vector<char>& best = ied.next();
      if (best.size() == 0) ref.push_back( char2action('$') );
      else for (char c : best) ref.push_back( char2action(c) );
      char c = action2char( Search::predictor(sch, m)
                            .set_input(* ex.get())
                            .set_oracle(ref)
                            .predict() );
      */

      vector< pair<action,float> > all = ied.all_next();
      char c = action2char( Search::predictor(sch, m)
                            .set_input(* ex.get())
                            .set_allowed(all)
                            .predict() );

      if (c == '$') break;
      out += c;
      ied.append(c);
      if (cdict) cdict = cdict->step(c);
    }

    dist = ied.finish_distance();
    sch.loss((float)dist * in.weight);
  }